

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fUniformApiTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::UniformCase::UniformCase
          (UniformCase *this,Context *context,char *name,char *description,deUint32 seed)

{
  StructType *this_00;
  UniformCase *pUVar1;
  _Alloc_hider name_;
  int iVar2;
  deUint32 dVar3;
  int iVar4;
  undefined4 extraout_var;
  UniformCollection *ptr;
  VarType *type;
  int j;
  long lVar5;
  int local_114;
  UniformCase *local_110;
  deUint32 local_104;
  uint local_100;
  int structIdx;
  vector<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_> structTypes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  Random rnd;
  VarType local_a0;
  Uniform uniform;
  string local_50;
  
  gles3::TestCase::TestCase(&this->super_TestCase,context,name,description);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__UniformCase_01e3a960;
  iVar2 = (*context->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&this->super_CallLogWrapper,(Functions *)CONCAT44(extraout_var,iVar2),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__UniformCase_01e3a960;
  dVar3 = randomFeatures(seed);
  *(deUint32 *)&(this->super_CallLogWrapper).field_0x14 = dVar3;
  deRandom_init(&rnd.m_rnd,seed);
  dVar3 = deRandom_getUint32(&rnd.m_rnd);
  local_100 = dVar3 % 5;
  structIdx = 0;
  ptr = (UniformCollection *)operator_new(0x30);
  (ptr->m_structTypes).
  super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (ptr->m_structTypes).
  super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (ptr->m_uniforms).
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Uniform>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (ptr->m_structTypes).
  super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (ptr->m_uniforms).
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Uniform>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (ptr->m_uniforms).
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Uniform>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_110 = this;
  local_104 = seed;
  for (local_114 = 0; pUVar1 = local_110, local_114 <= (int)local_100; local_114 = local_114 + 1) {
    structTypes.
    super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    structTypes.
    super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    structTypes.
    super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    de::toString<int>(&local_50,&local_114);
    std::operator+(&local_d0,"u_var",&local_50);
    name_._M_p = local_d0._M_dataplus._M_p;
    glu::VarType::VarType(&local_a0);
    anon_unknown_1::Uniform::Uniform(&uniform,name_._M_p,&local_a0);
    glu::VarType::~VarType(&local_a0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_50);
    lVar5 = 0;
    do {
      while( true ) {
        if ((int)((ulong)((long)structTypes.
                                super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)structTypes.
                               super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3) <= lVar5) break;
        this_00 = structTypes.
                  super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar5];
        if (this_00 != (StructType *)0x0) {
          glu::StructType::~StructType(this_00);
        }
        operator_delete(this_00,0x38);
        lVar5 = lVar5 + 1;
      }
      if (structTypes.
          super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          structTypes.
          super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        structTypes.
        super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             structTypes.
             super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
      }
      de::toString<int>(&local_50,&local_114);
      std::operator+(&local_d0,"u_var",&local_50);
      generateRandomType(&local_a0,3,&structIdx,&structTypes,&rnd);
      type = &local_a0;
      glu::VarType::operator=(&uniform.type,&local_a0);
      glu::VarType::~VarType(&local_a0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_50);
      iVar2 = anon_unknown_1::UniformCollection::getNumSamplers(ptr);
      iVar4 = getNumSamplersInType((Functional *)&uniform.type,type);
      lVar5 = 0;
    } while (0x10 < iVar4 + iVar2);
    anon_unknown_1::UniformCollection::addUniform(ptr,&uniform);
    for (lVar5 = 0;
        lVar5 < (int)((ulong)((long)structTypes.
                                    super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)structTypes.
                                   super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3);
        lVar5 = lVar5 + 1) {
      anon_unknown_1::UniformCollection::addStructType
                (ptr,structTypes.
                     super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar5]);
    }
    anon_unknown_1::Uniform::~Uniform(&uniform);
    std::_Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>::
    ~_Vector_base(&structTypes.
                   super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>
                 );
  }
  de::SharedPtr<const_deqp::gles3::Functional::(anonymous_namespace)::UniformCollection>::SharedPtr
            (&this->m_uniformCollection,ptr);
  deRandom_init((deRandom *)&uniform,local_104);
  dVar3 = deRandom_getUint32((deRandom *)&uniform);
  pUVar1->m_caseShaderType = dVar3 % 3;
  (pUVar1->m_textures2d).super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pUVar1->m_textures2d).super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pUVar1->m_textures2d).super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pUVar1->m_texturesCube).
  super__Vector_base<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pUVar1->m_texturesCube).
  super__Vector_base<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pUVar1->m_texturesCube).
  super__Vector_base<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pUVar1->m_filledTextureUnits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pUVar1->m_filledTextureUnits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pUVar1->m_filledTextureUnits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

UniformCase::UniformCase (Context& context, const char* name, const char* description, const deUint32 seed)
	: TestCase				(context, name, description)
	, CallLogWrapper		(context.getRenderContext().getFunctions(), m_testCtx.getLog())
	, m_features			(randomFeatures(seed))
	, m_uniformCollection	(UniformCollection::random(seed))
	, m_caseShaderType		(randomCaseShaderType(seed))
{
}